

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O3

int process_stream_file(char *stream_file_name)

{
  bool bVar1;
  bool bVar2;
  _Alloc_hider __s1;
  size_type sVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  size_t sVar8;
  undefined8 *puVar9;
  ulong *puVar10;
  long *plVar11;
  size_type sVar12;
  uint uVar13;
  string code;
  string fileName;
  string parent;
  string buf;
  string stream;
  string sqconfig;
  string child;
  ifstream tmp;
  TrustedContext local_34c;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  char *local_2a8;
  string local_2a0;
  string local_280;
  char *local_260;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  long local_238 [4];
  byte abStack_218 [200];
  undefined8 auStack_150 [36];
  
  std::ifstream::ifstream(local_238,stream_file_name,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_2c8,
               *(undefined8 *)((long)auStack_150 + *(long *)(local_238[0] + -0x18)),0xffffffff);
    if (local_2c0 == 0) {
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a0,"Stream file is empty \'","");
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
      puVar10 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_348.field_2._M_allocated_capacity = *puVar10;
        local_348.field_2._8_8_ = puVar9[3];
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      }
      else {
        local_348.field_2._M_allocated_capacity = *puVar10;
        local_348._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_348._M_string_length = puVar9[1];
      *puVar9 = puVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
      puVar10 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_328.field_2._M_allocated_capacity = *puVar10;
        local_328.field_2._8_8_ = puVar9[3];
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      }
      else {
        local_328.field_2._M_allocated_capacity = *puVar10;
        local_328._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_328._M_string_length = puVar9[1];
      *puVar9 = puVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      CompilationContext::globalError(local_328._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      uVar13 = 1;
    }
    else {
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      uVar13 = 0;
      local_328._M_string_length = 0;
      local_328.field_2._M_allocated_capacity =
           local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      local_348._M_string_length = 0;
      local_348.field_2._M_allocated_capacity =
           local_348.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      local_2a0._M_string_length = 0;
      local_2a0.field_2._M_local_buf[0] = '\0';
      local_34c = TR_CONST;
      bVar2 = false;
      plVar7 = local_2c8;
      do {
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        local_2e8._M_string_length = 0;
        local_2e8.field_2._M_local_buf[0] = '\0';
        plVar7 = (long *)next_string((char *)plVar7,&local_2e8);
        if (bVar2) {
          if ((*local_2e8._M_dataplus._M_p == '#') && (local_2e8._M_dataplus._M_p[1] == '#')) {
LAB_0011a298:
            if (local_2e8._M_dataplus._M_p[1] != '#') goto LAB_0011a29e;
LAB_0011a2a4:
            uVar5 = process_single_source(&local_328,&local_348,&local_2a0,false,false);
            uVar13 = uVar13 | uVar5;
            bVar2 = false;
            goto LAB_0011a2ca;
          }
          std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_2e8._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_348);
          if (*local_2e8._M_dataplus._M_p == '#') goto LAB_0011a298;
LAB_0011a29e:
          if ((char)*plVar7 == '\0') goto LAB_0011a2a4;
LAB_0011a2d9:
          __s1._M_p = local_2e8._M_dataplus._M_p;
          iVar6 = strncmp(local_2e8._M_dataplus._M_p,"###[FILE_NAME]",0xe);
          if (iVar6 == 0) {
            local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
            sVar8 = strlen(__s1._M_p + 0xe);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_308,__s1._M_p + 0xe,__s1._M_p + sVar8 + 0xe);
            std::__cxx11::string::operator=((string *)&local_328,(string *)&local_308);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_308._M_dataplus._M_p != &local_308.field_2) {
              operator_delete(local_308._M_dataplus._M_p);
            }
            trusted::clear();
            local_348._M_string_length = 0;
            *local_348._M_dataplus._M_p = '\0';
            bVar2 = false;
          }
          else {
            iVar6 = strncmp(__s1._M_p,"###[SQCONFIG]",0xd);
            if (iVar6 != 0) {
              iVar6 = strcmp(__s1._M_p,"###[LOCALS]");
              bVar1 = true;
              if (iVar6 == 0) {
                local_34c = TR_LOCAL;
              }
              else {
                iVar6 = strcmp(__s1._M_p,"###[GLOBALS]");
                if (iVar6 == 0) {
                  local_34c = TR_GLOBAL;
                }
                else {
                  iVar6 = strcmp(__s1._M_p,"###[CONSTANTS]");
                  if (iVar6 == 0) {
                    local_34c = TR_CONST;
                  }
                  else {
                    iVar6 = strcmp(__s1._M_p,"###[CODE]");
                    sVar3 = local_2e8._M_string_length;
                    if (iVar6 == 0) {
                      bVar1 = true;
                      bVar2 = true;
                    }
                    else {
                      bVar1 = true;
                      if ((local_2e8._M_string_length != 0) && (!bVar2)) {
                        local_2a8 = strchr(__s1._M_p,0x2e);
                        sVar12 = (long)local_2a8 - (long)__s1._M_p;
                        if (local_2a8 == (char *)0x0) {
                          sVar12 = sVar3;
                        }
                        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_308,__s1._M_p,__s1._M_p + sVar12);
                        pcVar4 = local_2a8;
                        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
                        local_280._M_string_length = 0;
                        local_280.field_2._M_local_buf[0] = '\0';
                        if (local_2a8 != (char *)0x0) {
                          local_260 = local_2a8 + 1;
                          local_258[0] = local_248;
                          sVar8 = strlen(local_260);
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_258,local_260,pcVar4 + sVar8 + 1);
                          std::__cxx11::string::operator=((string *)&local_280,(string *)local_258);
                          if (local_258[0] != local_248) {
                            operator_delete(local_258[0]);
                          }
                        }
                        trusted::add(local_34c,&local_308,&local_280);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_280._M_dataplus._M_p != &local_280.field_2) {
                          operator_delete(local_280._M_dataplus._M_p);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_308._M_dataplus._M_p != &local_308.field_2) {
                          operator_delete(local_308._M_dataplus._M_p);
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_0011a468;
            }
            local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
            sVar8 = strlen(__s1._M_p + 0xd);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_308,__s1._M_p + 0xd,__s1._M_p + sVar8 + 0xd);
            std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_308);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_308._M_dataplus._M_p != &local_308.field_2) {
              operator_delete(local_308._M_dataplus._M_p);
            }
          }
          bVar1 = true;
        }
        else {
LAB_0011a2ca:
          if ((char)*plVar7 != '\0') goto LAB_0011a2d9;
          bVar1 = false;
        }
LAB_0011a468:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
      } while (bVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8);
    }
  }
  else {
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_348,"Cannot open strem file \'","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_348);
    puVar10 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_328.field_2._M_allocated_capacity = *puVar10;
      local_328.field_2._8_8_ = plVar7[3];
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    }
    else {
      local_328.field_2._M_allocated_capacity = *puVar10;
      local_328._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_328._M_string_length = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_328);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_2b8 = *plVar11;
      lStack_2b0 = plVar7[3];
      local_2c8 = &local_2b8;
    }
    else {
      local_2b8 = *plVar11;
      local_2c8 = (long *)*plVar7;
    }
    local_2c0 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    CompilationContext::globalError((char *)local_2c8);
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p);
    }
    uVar13 = 1;
  }
  std::ifstream::~ifstream(local_238);
  return uVar13;
}

Assistant:

int process_stream_file(const char * stream_file_name)
{
  ifstream tmp(stream_file_name);
  if (tmp.fail())
  {
    CompilationContext::globalError((string("Cannot open strem file '") + stream_file_name + "'").c_str());
    return 1;
  }

  string stream((std::istreambuf_iterator<char>(tmp)), std::istreambuf_iterator<char>());
  if (stream.empty())
  {
    CompilationContext::globalError((string("Stream file is empty '") + stream_file_name + "'").c_str());
    return 1;
  }

  int res = 0;
  const char * p = stream.c_str();

  string fileName;
  trusted::TrustedContext trustedContext = trusted::TR_CONST;
  string code;
  string sqconfig;
  bool insideCode = false;

  for (;;)
  {
    string buf;
    p = next_string(p, buf);

    if (insideCode)
    {
      if (buf[0] != '#' || buf[1] != '#')
      {
        code += buf;
        code += "\n";
      }

      if ((buf[0] == '#' && buf[1] == '#') || !*p) // end of code
      {
        res |= process_single_source(fileName, code, sqconfig, false, false);
        insideCode = false;
      }
    }

    if (!*p)
      break;

    if (!strncmp(buf.c_str(), "###[FILE_NAME]", sizeof("###[FILE_NAME]") - 1))
    {
      fileName = string(buf.c_str() + sizeof("###[FILE_NAME]") - 1);
      trusted::clear();
      code.clear();
      insideCode = false;
    }
    else if (!strncmp(buf.c_str(), "###[SQCONFIG]", sizeof("###[SQCONFIG]") - 1))
      sqconfig = string(buf.c_str() + sizeof("###[SQCONFIG]") - 1);
    else if (!strcmp(buf.c_str(), "###[LOCALS]"))
      trustedContext = trusted::TR_LOCAL;
    else if (!strcmp(buf.c_str(), "###[GLOBALS]"))
      trustedContext = trusted::TR_GLOBAL;
    else if (!strcmp(buf.c_str(), "###[CONSTANTS]"))
      trustedContext = trusted::TR_CONST;
    else if (!strcmp(buf.c_str(), "###[CODE]"))
    {
      insideCode = true;
    }
    else if (!buf.empty() && !insideCode)
    {
      const char * dot = strchr(buf.c_str(), '.');
      string parent(buf.c_str(), dot ? dot - buf.c_str() : buf.length());
      string child;
      if (dot)
        child = string(dot + 1);

      trusted::add(trustedContext, parent, child);
    }
  }

  return res;
}